

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O3

mod2entry * mod2sparse_insert(mod2sparse *m,int row,int col)

{
  mod2entry **ppmVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  mod2entry *pmVar5;
  mod2block *pmVar6;
  mod2entry *pmVar7;
  mod2entry *pmVar8;
  mod2entry *pmVar9;
  long extraout_RDX;
  long extraout_RDX_00;
  uint uVar10;
  undefined4 in_register_00000034;
  FILE *pFVar11;
  FILE *r;
  FILE *pFVar12;
  FILE *__stream;
  ulong uVar13;
  long lVar14;
  ulong uStack_b0;
  
  pFVar11 = (FILE *)CONCAT44(in_register_00000034,row);
  if ((((-1 < row) && (-1 < col)) && (row < m->n_rows)) && (col < m->n_cols)) {
    pmVar8 = m->rows[(uint)row].left;
    if (pmVar8->row < 0) {
LAB_001215ce:
      pmVar8 = pmVar8->right;
    }
    else {
      if (pmVar8->col == col) {
        return pmVar8;
      }
      if (pmVar8->col < col) goto LAB_001215ce;
      for (pmVar8 = m->rows[(uint)row].right; -1 < pmVar8->row; pmVar8 = pmVar8->right) {
        iVar3 = pmVar8->col;
        if (iVar3 == col) {
          return pmVar8;
        }
        if (iVar3 != col && col <= iVar3) break;
      }
    }
    pmVar7 = m->next_free;
    if (pmVar7 == (mod2entry *)0x0) {
      pmVar6 = (mod2block *)chk_alloc(1,0x238);
      pmVar6->next = m->blocks;
      m->blocks = pmVar6;
      pmVar7 = (mod2entry *)&pmVar6[-1].entry[9].left;
      lVar14 = 10;
      pmVar5 = m->next_free;
      do {
        pmVar9 = pmVar5;
        pmVar7[1].left = pmVar9;
        pmVar7 = pmVar7 + 1;
        lVar14 = lVar14 + -1;
        pmVar5 = pmVar7;
      } while (lVar14 != 0);
    }
    else {
      pmVar9 = pmVar7->left;
    }
    m->next_free = pmVar9;
    pmVar7->pr = 0.0;
    pmVar7->lr = 0.0;
    pmVar7->row = row;
    pmVar7->col = col;
    pmVar5 = pmVar8->left;
    pmVar7->left = pmVar5;
    pmVar7->right = pmVar8;
    pmVar5->right = pmVar7;
    pmVar7->right->left = pmVar7;
    ppmVar1 = &m->cols;
    pFVar11 = (FILE *)(*ppmVar1)[(uint)col].up;
    uVar2 = pFVar11->_flags;
    m = (mod2sparse *)(ulong)uVar2;
    if (uVar2 == row && -1 < (int)uVar2) goto LAB_001216e2;
    if ((int)uVar2 < row) {
      pmVar8 = (mod2entry *)pFVar11->_IO_write_base;
LAB_0012166d:
      pmVar5 = pmVar8->up;
      pmVar7->up = pmVar5;
      pmVar7->down = pmVar8;
      pmVar5->down = pmVar7;
      pmVar7->down->up = pmVar7;
      return pmVar7;
    }
    pmVar8 = (*ppmVar1)[(uint)col].down;
    while( true ) {
      uVar2 = pmVar8->row;
      pFVar11 = (FILE *)CONCAT71((int7)((ulong)pFVar11 >> 8),-1 < (int)uVar2);
      m = (mod2sparse *)CONCAT71((int7)((ulong)m >> 8),uVar2 == row);
      if (-1 < (int)uVar2 && uVar2 == row) break;
      if ((uint)row < uVar2) goto LAB_0012166d;
      pmVar8 = pmVar8->down;
    }
    mod2sparse_insert_cold_1();
  }
  mod2sparse_insert_cold_3();
LAB_001216e2:
  mod2sparse_insert_cold_2();
  r = pFVar11;
  pFVar12 = (FILE *)m;
  if (*(int *)&((FILE *)m)->field_0x4 <= *(int *)&pFVar11->field_0x4) {
    pFVar12 = pFVar11;
    mod2sparse_clear((mod2sparse *)pFVar11);
    pmVar8 = (mod2entry *)(ulong)(uint)pFVar11->_flags;
    if (0 < pFVar11->_flags) {
      uVar13 = 0;
      do {
        iVar3 = *(int *)(extraout_RDX + uVar13 * 4);
        if (((long)iVar3 < 0) || (((FILE *)m)->_flags <= iVar3)) {
          mod2sparse_copyrows_cold_1();
          goto LAB_0012176c;
        }
        pmVar7 = ((mod2entry *)((FILE *)m)->_IO_read_ptr)[iVar3].right;
        if (-1 < pmVar7->row) {
          do {
            r = (FILE *)(uVar13 & 0xffffffff);
            pFVar12 = pFVar11;
            mod2sparse_insert((mod2sparse *)pFVar11,(int)uVar13,pmVar7->col);
            pmVar7 = pmVar7->right;
          } while (-1 < pmVar7->row);
          pmVar8 = (mod2entry *)(ulong)(uint)pFVar11->_flags;
        }
        uVar13 = uVar13 + 1;
      } while ((long)uVar13 < (long)(int)pmVar8);
    }
    return pmVar8;
  }
LAB_0012176c:
  mod2sparse_copyrows_cold_2();
  pFVar11 = r;
  __stream = pFVar12;
  if (pFVar12->_flags <= r->_flags) {
    __stream = r;
    mod2sparse_clear((mod2sparse *)r);
    pmVar8 = (mod2entry *)(ulong)*(uint *)&r->field_0x4;
    if (0 < (int)*(uint *)&r->field_0x4) {
      lVar14 = 0;
      do {
        iVar3 = *(int *)(extraout_RDX_00 + lVar14 * 4);
        if (((long)iVar3 < 0) || (*(int *)&pFVar12->field_0x4 <= iVar3)) {
          mod2sparse_copycols_cold_1();
          goto LAB_001217f5;
        }
        pmVar7 = ((mod2entry *)pFVar12->_IO_read_end)[iVar3].down;
        pFVar11 = (FILE *)(ulong)(uint)pmVar7->row;
        if (-1 < pmVar7->row) {
          do {
            __stream = r;
            mod2sparse_insert((mod2sparse *)r,(int)pFVar11,(int)lVar14);
            pmVar7 = pmVar7->down;
            pFVar11 = (FILE *)(ulong)(uint)pmVar7->row;
          } while (-1 < pmVar7->row);
          pmVar8 = (mod2entry *)(ulong)*(uint *)&r->field_0x4;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < (int)pmVar8);
    }
    return pmVar8;
  }
LAB_001217f5:
  mod2sparse_copycols_cold_2();
  uVar2 = pFVar11->_flags;
  pmVar8 = (mod2entry *)(ulong)uVar2;
  uVar10 = 1;
  uStack_b0 = 0x100000000;
  if ((((10 < (int)uVar2) && (uStack_b0 = 0x200000000, 100 < uVar2)) &&
      (uStack_b0 = 0x300000000, 1000 < uVar2)) && (uStack_b0 = 0x400000000, 10000 < uVar2)) {
    uStack_b0 = (ulong)(6 - (uVar2 < 0x186a1)) << 0x20;
  }
  uVar4 = *(uint *)&pFVar11->field_0x4;
  if (((10 < (int)uVar4) && (uVar10 = 2, 100 < uVar4)) &&
     ((uVar10 = 3, 1000 < uVar4 && (uVar10 = 4, 10000 < uVar4)))) {
    uVar10 = 6 - (uVar4 < 0x186a1);
  }
  if (0 < (int)uVar2) {
    uVar13 = 0;
    do {
      fprintf(__stream,"%*d:",uStack_b0 >> 0x20,uVar13 & 0xffffffff);
      for (pmVar8 = ((mod2entry *)pFVar11->_IO_read_ptr)[uVar13].right; -1 < pmVar8->row;
          pmVar8 = pmVar8->right) {
        fprintf(__stream," %*d",(ulong)uVar10,(ulong)(uint)pmVar8->col);
      }
      fputc(10,__stream);
      uVar13 = uVar13 + 1;
      pmVar8 = (mod2entry *)(long)pFVar11->_flags;
    } while ((long)uVar13 < (long)pmVar8);
  }
  return pmVar8;
}

Assistant:

mod2entry *mod2sparse_insert
( mod2sparse *m,
  int row,
  int col
)
{
  mod2entry *re, *ce, *ne;

  if (row<0 || row>=mod2sparse_rows(m) || col<0 || col>=mod2sparse_cols(m))
  { fprintf(stderr,"mod2sparse_insert: row or column index out of bounds\n");
    exit(1);
  }

  /* Find old entry and return it, or allocate new entry and insert into row. */

  re = mod2sparse_last_in_row(m,row);

  if (!mod2sparse_at_end(re) && mod2sparse_col(re)==col) 
  { return re;
  }

  if (mod2sparse_at_end(re) || mod2sparse_col(re)<col) 
  { re = re->right;
  }
  else
  {
    re = mod2sparse_first_in_row(m,row);

    for (;;)
    { 
      if (!mod2sparse_at_end(re) && mod2sparse_col(re)==col) 
      { return re;
      }

      if (mod2sparse_at_end(re) || mod2sparse_col(re)>col)
      { break;
      } 

      re = mod2sparse_next_in_row(re);
    }
  }

  ne = alloc_entry(m);

  ne->row = row;
  ne->col = col;

  ne->left = re->left;
  ne->right = re;
  ne->left->right = ne;
  ne->right->left = ne;

  /* Insert new entry into column.  If we find an existing entry here,
     the matrix must be garbled, since we didn't find it in the row. */

  ce = mod2sparse_last_in_col(m,col);

  if (!mod2sparse_at_end(ce) && mod2sparse_row(ce)==row) 
  { fprintf(stderr,"mod2sparse_insert: Garbled matrix\n");
    exit(1);
  }

  if (mod2sparse_at_end(ce) || mod2sparse_row(ce)<row) 
  { ce = ce->down;
  }
  else
  {
    ce = mod2sparse_first_in_col(m,col);

    for (;;)
    { 
      if (!mod2sparse_at_end(ce) && mod2sparse_row(ce)==row) 
      { fprintf(stderr,"mod2sparse_insert: Garbled matrix\n");
        exit(1);
      }

      if (mod2sparse_at_end(ce) || mod2sparse_row(ce)>row)
      { break;
      } 

      ce = mod2sparse_next_in_col(ce);
    }
  }
    
  ne->up = ce->up;
  ne->down = ce;
  ne->up->down = ne;
  ne->down->up = ne;

  /* Return the new entry. */

  return ne;
}